

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::convertTextData<unsigned_short>
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_short *source,
          char *pointerToStore,int sizeWithoutHeader)

{
  unsigned_long *puVar1;
  ushort uVar2;
  ushort *puVar3;
  ulong uVar4;
  
  if (((0x2bU >> ((byte)this->TargetFormat & 0x1f) &
       this->TargetFormat < (ETF_UTF32_BE|ETF_UTF16_BE)) !=
       (0x2bU >> ((byte)this->SourceFormat & 0x1f) &
       this->SourceFormat < (ETF_UTF32_BE|ETF_UTF16_BE))) && (uVar2 = *source, uVar2 != 0)) {
    puVar3 = source + 1;
    do {
      puVar3[-1] = uVar2 << 8 | uVar2 >> 8;
      uVar2 = *puVar3;
      puVar3 = puVar3 + 1;
    } while (uVar2 != 0);
  }
  uVar4 = 0xffffffffffffffff;
  if (-1 < sizeWithoutHeader) {
    uVar4 = (long)sizeWithoutHeader * 8;
  }
  puVar1 = (unsigned_long *)operator_new__(uVar4);
  this->TextData = puVar1;
  __assert_fail("numShift < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/irrXML/CXMLReaderImpl.h"
                ,0x2a9,
                "void irr::io::CXMLReaderImpl<unsigned long, irr::io::IXMLBase>::convertTextData(src_char_type *, char *, int) [char_type = unsigned long, superclass = irr::io::IXMLBase, src_char_type = unsigned short]"
               );
}

Assistant:

void convertTextData(src_char_type* source, char* pointerToStore, int sizeWithoutHeader)
	{
		// convert little to big endian if necessary
		if (sizeof(src_char_type) > 1 && 
			isLittleEndian(TargetFormat) != isLittleEndian(SourceFormat))
			convertToLittleEndian(source);

		// check if conversion is necessary:
		if (sizeof(src_char_type) == sizeof(char_type))
		{
			// no need to convert
			TextBegin = (char_type*)source;
			TextData = (char_type*)pointerToStore;
			TextSize = sizeWithoutHeader;
		}
		else
		{
			// convert source into target data format. 
			// TODO: implement a real conversion. This one just 
			// copies bytes. This is a problem when there are 
			// unicode symbols using more than one character.

			TextData = new char_type[sizeWithoutHeader];

			// MSVC debugger complains here about loss of data ...
			size_t numShift = sizeof( char_type) * 8;
			assert(numShift < 64);
			const src_char_type cc = (src_char_type)(((uint64_t(1u) << numShift) - 1));
			for (int i=0; i<sizeWithoutHeader; ++i)
				TextData[i] = char_type( source[i] & cc); 

			TextBegin = TextData;
			TextSize = sizeWithoutHeader;

			// delete original data because no longer needed
			delete [] pointerToStore;
		}
	}